

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::Address
          (Address *this,string *address_string,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  bool bVar1;
  string local_58;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_38;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *params;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_20;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *network_parameters_local;
  string *address_string_local;
  Address *this_local;
  
  this->type_ = kCfdSuccess;
  this->addr_type_ = kP2shAddress;
  this->witness_ver_ = kVersionNone;
  local_20 = network_parameters;
  network_parameters_local =
       (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
       address_string;
  address_string_local = (string *)this;
  ::std::__cxx11::string::string((string *)&this->address_,(string *)address_string);
  ByteData::ByteData(&this->hash_);
  Pubkey::Pubkey(&this->pubkey_);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_);
  AddressFormatData::AddressFormatData(&this->format_data_);
  memset(this->checksum_,0,4);
  local_38 = (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0;
  bVar1 = ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ::empty(local_20);
  if (!bVar1) {
    local_38 = local_20;
  }
  ::std::__cxx11::string::string((string *)&local_58,(string *)network_parameters_local);
  DecodeAddress(this,&local_58,local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

Address::Address(
    const std::string& address_string,
    const std::vector<AddressFormatData>& network_parameters)
    : type_(kMainnet),
      addr_type_(kP2shAddress),
      witness_ver_(kVersionNone),
      address_(address_string),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));
  const std::vector<AddressFormatData>* params = nullptr;
  if (!network_parameters.empty()) {
    params = &network_parameters;
  }
  DecodeAddress(address_string, params);
}